

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeClearObject(sqlite3 *db,Vdbe *p)

{
  SubProgram *pSVar1;
  SubProgram *p_00;
  
  releaseMemArray(p->aColName,(uint)p->nResColumn * 2);
  p_00 = p->pProgram;
  while (p_00 != (SubProgram *)0x0) {
    pSVar1 = p_00->pNext;
    vdbeFreeOpArray(db,p_00->aOp,p_00->nOp);
    sqlite3DbFreeNN(db,p_00);
    p_00 = pSVar1;
  }
  if (p->magic != 0x16bceaa5) {
    releaseMemArray(p->aVar,(int)p->nVar);
    if (p->pVList != (VList *)0x0) {
      sqlite3DbFreeNN(db,p->pVList);
    }
    if (p->pFree != (void *)0x0) {
      sqlite3DbFreeNN(db,p->pFree);
    }
  }
  vdbeFreeOpArray(db,p->aOp,p->nOp);
  if (p->aColName != (Mem *)0x0) {
    sqlite3DbFreeNN(db,p->aColName);
  }
  if (p->zSql == (char *)0x0) {
    return;
  }
  sqlite3DbFreeNN(db,p->zSql);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeClearObject(sqlite3 *db, Vdbe *p){
  SubProgram *pSub, *pNext;
  assert( p->db==0 || p->db==db );
  releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
  for(pSub=p->pProgram; pSub; pSub=pNext){
    pNext = pSub->pNext;
    vdbeFreeOpArray(db, pSub->aOp, pSub->nOp);
    sqlite3DbFree(db, pSub);
  }
  if( p->magic!=VDBE_MAGIC_INIT ){
    releaseMemArray(p->aVar, p->nVar);
    sqlite3DbFree(db, p->pVList);
    sqlite3DbFree(db, p->pFree);
  }
  vdbeFreeOpArray(db, p->aOp, p->nOp);
  sqlite3DbFree(db, p->aColName);
  sqlite3DbFree(db, p->zSql);
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  {
    int i;
    for(i=0; i<p->nScan; i++){
      sqlite3DbFree(db, p->aScan[i].zName);
    }
    sqlite3DbFree(db, p->aScan);
  }
#endif
}